

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evloop_epoll.c
# Opt level: O0

ev_impl * ev_epoll_open(void)

{
  int iVar1;
  ev_impl *impl;
  ev_impl *local_8;
  
  local_8 = (ev_impl *)malloc(4);
  iVar1 = epoll_create(0x80);
  local_8->epollfd = iVar1;
  if (local_8->epollfd == -1) {
    perror("epoll_create()");
    free(local_8);
    local_8 = (ev_impl *)0x0;
  }
  return local_8;
}

Assistant:

struct ev_impl * ev_epoll_open(void)
{
  struct ev_impl * impl = malloc(sizeof(struct ev_impl));
  impl->epollfd = epoll_create(128);
  if(impl->epollfd == -1)
    perror("epoll_create()");
  else
    return impl;
  free(impl);
  return NULL;
}